

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encode.cpp
# Opt level: O1

size_t duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality,int lgwin,size_t input_size)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  size_t sVar9;
  long lVar10;
  ulong uVar11;
  int local_598;
  undefined8 local_578;
  byte local_570;
  SharedEncoderDictionary local_550;
  
  BrotliInitSharedEncoderDictionary(&local_550);
  iVar3 = 0;
  if (0 < quality) {
    iVar3 = quality;
  }
  iVar1 = 0xb;
  if (iVar3 < 0xb) {
    iVar1 = iVar3;
  }
  iVar3 = 10;
  if (lgwin < 10) {
LAB_002fd486:
    local_598 = iVar3;
  }
  else {
    iVar3 = 0x1e;
    if (quality < 3 || lgwin < 0x19) {
      iVar3 = 0x18;
    }
    local_598 = lgwin;
    if (iVar3 < lgwin) goto LAB_002fd486;
  }
  iVar3 = local_598;
  if ((((1 < quality) && (iVar3 = 0xe, 3 < quality)) && (iVar3 = 0x10, 8 < quality)) &&
     ((0x10 < local_598 && (iVar3 = 0x12, local_598 < 0x12)))) {
    iVar3 = local_598;
  }
  if (quality < 10) {
    if (input_size < 0x100000 || quality != 4) {
      if (quality < 5) {
        local_578 = CONCAT44(local_578._4_4_,iVar1);
      }
      else if (local_598 < 0x11) {
        iVar1 = 0x28;
        if (6 < quality) {
          iVar1 = (quality == 9) + 0x29;
        }
        local_578 = CONCAT44(local_578._4_4_,iVar1);
      }
      else {
        local_570 = (char)iVar1 - 1;
        if (local_598 < 0x13 || input_size < 0x100000) {
          local_578 = (ulong)CONCAT14(quality < 7,5) ^ 0xf00000000;
        }
        else {
          local_578 = 0xf00000006;
        }
      }
    }
    else {
      local_578 = CONCAT44(local_578._4_4_,0x36);
    }
  }
  else {
    local_578 = CONCAT44(local_578._4_4_,10);
  }
  if (0x18 < local_598) {
    if ((int)local_578 == 3) {
      local_578 = CONCAT44(local_578._4_4_,0x23);
    }
    if ((int)local_578 == 0x36) {
      local_578 = CONCAT44(local_578._4_4_,0x37);
    }
    if ((int)local_578 == 6) {
      local_578 = CONCAT44(local_578._4_4_,0x41);
    }
  }
  if (quality < 2) {
    uVar7 = 1L << ((byte)local_598 & 0x3f);
    if (input_size < uVar7) {
      uVar7 = input_size;
    }
    uVar2 = 0x8000;
    if (quality == 1) {
      uVar2 = 0x20000;
    }
    if (uVar7 <= uVar2) {
      uVar2 = uVar7;
    }
    uVar11 = 0x100;
    do {
      uVar4 = uVar11;
      uVar11 = uVar4 * 2;
    } while (uVar4 < uVar2);
    lVar8 = 0;
    lVar5 = uVar4 * 4;
    if (uVar4 < 0x400) {
      lVar5 = lVar8;
    }
    if (quality == 1) {
      uVar2 = 0x20000;
      if (uVar7 < 0x20000) {
        uVar2 = uVar7;
      }
      lVar8 = uVar2 * 5;
    }
    lVar10 = lVar5 + 0x3908;
    if (quality != 1) {
      lVar10 = lVar5 + 0x3b10;
    }
    return lVar10 + lVar8;
  }
  uVar7 = 1L << ((byte)iVar3 & 0x3f);
  if (iVar3 < local_598) {
    iVar3 = local_598;
  }
  iVar3 = iVar3 + 1;
  sVar9 = (uint)(1 << ((byte)iVar3 & 0x1f)) + uVar7;
  if (input_size < uVar7) {
    sVar9 = input_size;
  }
  iVar1 = 0x18;
  if (iVar3 < 0x18) {
    iVar1 = iVar3;
  }
  uVar2 = 1L << ((byte)iVar1 & 0x3f);
  if (input_size < uVar2) {
    uVar2 = input_size;
  }
  if (input_size < uVar7) {
    uVar7 = input_size;
  }
  lVar8 = 0;
  if (0x22 < (int)local_578) {
    if ((int)local_578 < 0x36) {
      lVar10 = 0;
      lVar5 = 0;
      switch((int)local_578) {
      case 0x23:
        lVar8 = 0x40000;
LAB_002fd888:
        lVar5 = 0x4000000;
        lVar10 = 0;
        break;
      case 0x24:
      case 0x25:
      case 0x26:
      case 0x27:
        break;
      case 0x28:
      case 0x29:
        lVar8 = 0x40000;
        lVar5 = 0;
        lVar10 = 0x40000;
        break;
      case 0x2a:
        lVar10 = 0x100000;
        lVar8 = 0x40000;
        goto LAB_002fd800;
      default:
        goto switchD_002fd708_default;
      }
      goto switchD_002fd708_caseD_24;
    }
    if ((int)local_578 != 0x36) {
      if ((int)local_578 != 0x37) {
        lVar10 = 0;
        lVar5 = 0;
        if ((int)local_578 == 0x41) {
          lVar8 = 2L << (local_578._4_1_ & 0x3f);
          lVar10 = (4L << (local_578._4_1_ & 0x3f)) << (local_570 & 0x3f);
          lVar5 = 0x4000000;
        }
        goto switchD_002fd708_caseD_24;
      }
      lVar8 = 0x400000;
      goto LAB_002fd888;
    }
    lVar8 = 0x400000;
    goto switchD_002fd708_default;
  }
  lVar10 = 0;
  lVar5 = 0;
  switch((int)local_578) {
  case 2:
  case 3:
    lVar8 = 0x40000;
    break;
  case 4:
    lVar8 = 0x80000;
    break;
  case 5:
  case 6:
    lVar8 = 2L << (local_578._4_1_ & 0x3f);
    lVar10 = (4L << (local_578._4_1_ & 0x3f)) << (local_570 & 0x3f);
    goto LAB_002fd800;
  case 7:
  case 8:
  case 9:
    goto switchD_002fd708_caseD_24;
  case 10:
    uVar11 = 1L << ((byte)local_598 & 0x3f);
    if (input_size <= uVar11) {
      uVar11 = input_size;
    }
    lVar10 = uVar11 << 3;
    lVar8 = 0x80000;
    goto LAB_002fd800;
  }
switchD_002fd708_default:
  lVar10 = 0;
LAB_002fd800:
  lVar5 = 0;
switchD_002fd708_caseD_24:
  uVar11 = uVar7 * 6 + uVar2 * 2;
  if ((quality < 4) && (uVar7 = uVar7 * 0xc + 0x2fff0, uVar7 <= uVar11)) {
    uVar11 = uVar7;
  }
  lVar6 = 0xc800000;
  if (quality < 10) {
    if (quality < 4) {
      lVar6 = 0;
    }
    else {
      uVar7 = uVar2 / 0x1800;
      if (0xff < uVar7) {
        uVar7 = 0x100;
      }
      lVar6 = uVar7 * 0x17b0;
    }
  }
  return lVar6 + lVar8 + lVar10 + lVar5 + uVar11 + sVar9 + uVar2 * 2 + 0x1f7;
}

Assistant:

size_t  duckdb_brotli::BrotliEncoderEstimatePeakMemoryUsage(int quality, int lgwin,
                                            size_t input_size) {
  BrotliEncoderParams params;
  size_t memory_manager_slots = BROTLI_ENCODER_MEMORY_MANAGER_SLOTS;
  size_t memory_manager_size = memory_manager_slots * sizeof(void*);
  BrotliEncoderInitParams(&params);
  params.quality = quality;
  params.lgwin = lgwin;
  params.size_hint = input_size;
  params.large_window = lgwin > BROTLI_MAX_WINDOW_BITS;
  SanitizeParams(&params);
  params.lgblock = ComputeLgBlock(&params);
  ChooseHasher(&params, &params.hasher);
  if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY ||
      params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY) {
    size_t state_size = sizeof(BrotliEncoderState);
    size_t block_size = BROTLI_MIN(size_t, input_size, (1ul << params.lgwin));
    size_t hash_table_size =
        HashTableSize(MaxHashTableSize(params.quality), block_size);
    size_t hash_size =
        (hash_table_size < (1u << 10)) ? 0 : sizeof(int) * hash_table_size;
    size_t cmdbuf_size = params.quality == FAST_TWO_PASS_COMPRESSION_QUALITY ?
        5 * BROTLI_MIN(size_t, block_size, 1ul << 17) : 0;
    if (params.quality == FAST_ONE_PASS_COMPRESSION_QUALITY) {
      state_size += sizeof(BrotliOnePassArena);
    } else {
      state_size += sizeof(BrotliTwoPassArena);
    }
    return hash_size + cmdbuf_size + state_size;
  } else {
    size_t short_ringbuffer_size = (size_t)1 << params.lgblock;
    int ringbuffer_bits = ComputeRbBits(&params);
    size_t ringbuffer_size = input_size < short_ringbuffer_size ?
        input_size : (1u << ringbuffer_bits) + short_ringbuffer_size;
    size_t hash_size[4] = {0};
    size_t metablock_size =
        BROTLI_MIN(size_t, input_size, MaxMetablockSize(&params));
    size_t inputblock_size =
        BROTLI_MIN(size_t, input_size, (size_t)1 << params.lgblock);
    size_t cmdbuf_size = metablock_size * 2 + inputblock_size * 6;
    size_t outbuf_size = metablock_size * 2 + 503;
    size_t histogram_size = 0;
    HasherSize(&params, BROTLI_TRUE, input_size, hash_size);
    if (params.quality < MIN_QUALITY_FOR_BLOCK_SPLIT) {
      cmdbuf_size = BROTLI_MIN(size_t, cmdbuf_size,
          MAX_NUM_DELAYED_SYMBOLS * sizeof(Command) + inputblock_size * 12);
    }
    if (params.quality >= MIN_QUALITY_FOR_HQ_BLOCK_SPLITTING) {
      /* Only a very rough estimation, based on enwik8. */
      histogram_size = 200 << 20;
    } else if (params.quality >= MIN_QUALITY_FOR_BLOCK_SPLIT) {
      size_t literal_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t command_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      size_t distance_histograms =
          BROTLI_MIN(size_t, metablock_size / 6144, 256);
      histogram_size = literal_histograms * sizeof(HistogramLiteral) +
                       command_histograms * sizeof(HistogramCommand) +
                       distance_histograms * sizeof(HistogramDistance);
    }
    return (memory_manager_size + ringbuffer_size +
            hash_size[0] + hash_size[1] + hash_size[2] + hash_size[3] +
            cmdbuf_size +
            outbuf_size +
            histogram_size);
  }
}